

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.hpp
# Opt level: O2

void editFile(string *path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::operator+(&local_28,"vim ",path);
  system(local_28._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void editFile(std::string path) {
    system(("vim " + path).c_str());
}